

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::HasGoogleTestFlagPrefix(char *str)

{
  bool bVar1;
  bool bVar2;
  char *in_RDI;
  undefined6 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 in_stack_fffffffffffffff7;
  undefined1 uVar3;
  
  bVar1 = SkipPrefix(in_RDI,(char **)CONCAT17(in_stack_fffffffffffffff7,
                                              CONCAT16(in_stack_fffffffffffffff6,
                                                       in_stack_fffffffffffffff0)));
  if ((!bVar1) &&
     (bVar1 = SkipPrefix(in_RDI,(char **)CONCAT17(in_stack_fffffffffffffff7,
                                                  CONCAT16(in_stack_fffffffffffffff6,
                                                           in_stack_fffffffffffffff0))), !bVar1)) {
    bVar1 = SkipPrefix(in_RDI,(char **)CONCAT17(in_stack_fffffffffffffff7,
                                                CONCAT16(in_stack_fffffffffffffff6,
                                                         in_stack_fffffffffffffff0)));
    in_stack_fffffffffffffff7 = 0;
    if (!bVar1) {
      return false;
    }
  }
  bVar2 = SkipPrefix(in_RDI,(char **)CONCAT17(in_stack_fffffffffffffff7,
                                              CONCAT16(in_stack_fffffffffffffff6,
                                                       in_stack_fffffffffffffff0)));
  uVar3 = false;
  bVar1 = (bool)uVar3;
  if (!bVar2) {
    bVar2 = SkipPrefix(in_RDI,(char **)(ulong)CONCAT16(in_stack_fffffffffffffff6,
                                                       in_stack_fffffffffffffff0));
    bVar1 = true;
    if (!bVar2) {
      bVar1 = SkipPrefix(in_RDI,(char **)CONCAT17(uVar3,CONCAT16(1,in_stack_fffffffffffffff0)));
    }
  }
  return bVar1;
}

Assistant:

static bool HasGoogleTestFlagPrefix(const char* str) {
  return (SkipPrefix("--", &str) ||
          SkipPrefix("-", &str) ||
          SkipPrefix("/", &str)) &&
         !SkipPrefix(GTEST_FLAG_PREFIX_ "internal_", &str) &&
         (SkipPrefix(GTEST_FLAG_PREFIX_, &str) ||
          SkipPrefix(GTEST_FLAG_PREFIX_DASH_, &str));
}